

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::CappedArray<char,17ul>,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,CappedArray<char,_17UL> *params,
          char (*params_1) [3])

{
  ArrayPtr<const_char> local_30;
  kj *local_20;
  undefined8 local_18;
  
  local_18 = *(undefined8 *)this;
  local_20 = this + 8;
  local_30 = toCharSequence<char_const(&)[3]>((char (*) [3])params);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_20,&local_30,&local_30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}